

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_render_pass
          (Impl *this,VkRenderPassCreateInfo *create_info,ScratchAllocator *alloc,
          VkRenderPassCreateInfo **out_create_info)

{
  VkAttachmentDescription *pVVar1;
  VkSubpassDescription *pVVar2;
  VkSubpassDependency *pVVar3;
  undefined8 *puVar4;
  void *pvVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  VkRenderPassCreateFlags VVar9;
  uint32_t uVar10;
  VkStructureType VVar11;
  undefined4 uVar12;
  bool bVar13;
  VkRenderPassCreateInfo *pVVar14;
  VkAttachmentDescription *__dest;
  VkSubpassDescription *__dest_00;
  VkSubpassDependency *__dest_01;
  undefined8 *puVar15;
  void *pvVar16;
  ulong uVar17;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  
  pVVar14 = (VkRenderPassCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x40,0x10);
  if (pVVar14 != (VkRenderPassCreateInfo *)0x0) {
    VVar11 = create_info->sType;
    uVar12 = *(undefined4 *)&create_info->field_0x4;
    pvVar5 = create_info->pNext;
    VVar9 = create_info->flags;
    uVar10 = create_info->attachmentCount;
    pVVar1 = create_info->pAttachments;
    uVar7 = create_info->subpassCount;
    uVar8 = *(undefined4 *)&create_info->field_0x24;
    pVVar2 = create_info->pSubpasses;
    uVar6 = *(undefined4 *)&create_info->field_0x34;
    pVVar3 = create_info->pDependencies;
    pVVar14->dependencyCount = create_info->dependencyCount;
    *(undefined4 *)&pVVar14->field_0x34 = uVar6;
    pVVar14->pDependencies = pVVar3;
    pVVar14->subpassCount = uVar7;
    *(undefined4 *)&pVVar14->field_0x24 = uVar8;
    pVVar14->pSubpasses = pVVar2;
    pVVar14->flags = VVar9;
    pVVar14->attachmentCount = uVar10;
    pVVar14->pAttachments = pVVar1;
    pVVar14->sType = VVar11;
    *(undefined4 *)&pVVar14->field_0x4 = uVar12;
    pVVar14->pNext = pvVar5;
  }
  if ((ulong)pVVar14->attachmentCount == 0) {
LAB_0012ba5b:
    __dest = (VkAttachmentDescription *)0x0;
  }
  else {
    pVVar1 = pVVar14->pAttachments;
    sVar18 = (ulong)pVVar14->attachmentCount * 0x24;
    __dest = (VkAttachmentDescription *)ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
    if (__dest == (VkAttachmentDescription *)0x0) goto LAB_0012ba5b;
    memmove(__dest,pVVar1,sVar18);
  }
  pVVar14->pAttachments = __dest;
  if ((ulong)pVVar14->subpassCount == 0) {
LAB_0012ba9f:
    __dest_00 = (VkSubpassDescription *)0x0;
  }
  else {
    pVVar2 = pVVar14->pSubpasses;
    sVar18 = (ulong)pVVar14->subpassCount * 0x48;
    __dest_00 = (VkSubpassDescription *)ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
    if (__dest_00 == (VkSubpassDescription *)0x0) goto LAB_0012ba9f;
    memmove(__dest_00,pVVar2,sVar18);
  }
  pVVar14->pSubpasses = __dest_00;
  if ((ulong)pVVar14->dependencyCount != 0) {
    pVVar3 = pVVar14->pDependencies;
    sVar18 = (ulong)pVVar14->dependencyCount * 0x1c;
    __dest_01 = (VkSubpassDependency *)ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
    if (__dest_01 != (VkSubpassDependency *)0x0) {
      memmove(__dest_01,pVVar3,sVar18);
      goto LAB_0012bae8;
    }
  }
  __dest_01 = (VkSubpassDependency *)0x0;
LAB_0012bae8:
  pVVar14->pDependencies = __dest_01;
  if (pVVar14->subpassCount != 0) {
    lVar19 = 0x40;
    uVar20 = 0;
    do {
      pVVar2 = pVVar14->pSubpasses;
      puVar4 = *(undefined8 **)((long)pVVar2 + lVar19 + -0x10);
      if (puVar4 != (undefined8 *)0x0) {
        puVar15 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,8,0x10);
        if (puVar15 != (undefined8 *)0x0) {
          *puVar15 = *puVar4;
        }
        *(undefined8 **)((long)pVVar2 + lVar19 + -0x10) = puVar15;
      }
      pvVar5 = *(void **)((long)pVVar2 + lVar19 + -0x20);
      if (pvVar5 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar2 + lVar19 + -0x28);
        if (uVar17 == 0) {
LAB_0012bb77:
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 3;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 == (void *)0x0) goto LAB_0012bb77;
          memmove(pvVar16,pvVar5,sVar18);
        }
        *(void **)((long)pVVar2 + lVar19 + -0x20) = pvVar16;
      }
      pvVar5 = *(void **)((long)pVVar2 + lVar19 + -0x18);
      if (pvVar5 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar2 + lVar19 + -0x28);
        if (uVar17 == 0) {
LAB_0012bbc0:
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 3;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 == (void *)0x0) goto LAB_0012bbc0;
          memmove(pvVar16,pvVar5,sVar18);
        }
        *(void **)((long)pVVar2 + lVar19 + -0x18) = pvVar16;
      }
      pvVar5 = *(void **)((long)pVVar2 + lVar19 + -0x30);
      if (pvVar5 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar2 + lVar19 + -0x38);
        if (uVar17 == 0) {
LAB_0012bc09:
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 3;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 == (void *)0x0) goto LAB_0012bc09;
          memmove(pvVar16,pvVar5,sVar18);
        }
        *(void **)((long)pVVar2 + lVar19 + -0x30) = pvVar16;
      }
      pvVar5 = *(void **)((long)&pVVar2->flags + lVar19);
      if (pvVar5 != (void *)0x0) {
        uVar17 = (ulong)*(uint *)((long)pVVar2 + lVar19 + -8);
        if (uVar17 == 0) {
LAB_0012bc51:
          pvVar16 = (void *)0x0;
        }
        else {
          sVar18 = uVar17 << 2;
          pvVar16 = ScratchAllocator::allocate_raw(alloc,sVar18,0x10);
          if (pvVar16 == (void *)0x0) goto LAB_0012bc51;
          memmove(pvVar16,pvVar5,sVar18);
        }
        *(void **)((long)&pVVar2->flags + lVar19) = pvVar16;
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x48;
    } while (uVar20 < pVVar14->subpassCount);
  }
  bVar13 = copy_pnext_chain(this,create_info->pNext,alloc,&pVVar14->pNext,(DynamicStateInfo *)0x0,0)
  ;
  if (bVar13) {
    *out_create_info = pVVar14;
  }
  return bVar13;
}

Assistant:

bool StateRecorder::Impl::copy_render_pass(const VkRenderPassCreateInfo *create_info, ScratchAllocator &alloc,
                                           VkRenderPassCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->pAttachments = copy(info->pAttachments, info->attachmentCount, alloc);
	info->pSubpasses = copy(info->pSubpasses, info->subpassCount, alloc);
	info->pDependencies = copy(info->pDependencies, info->dependencyCount, alloc);

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		auto &sub = const_cast<VkSubpassDescription &>(info->pSubpasses[i]);
		if (sub.pDepthStencilAttachment)
			sub.pDepthStencilAttachment = copy(sub.pDepthStencilAttachment, 1, alloc);
		if (sub.pColorAttachments)
			sub.pColorAttachments = copy(sub.pColorAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pResolveAttachments)
			sub.pResolveAttachments = copy(sub.pResolveAttachments, sub.colorAttachmentCount, alloc);
		if (sub.pInputAttachments)
			sub.pInputAttachments = copy(sub.pInputAttachments, sub.inputAttachmentCount, alloc);
		if (sub.pPreserveAttachments)
			sub.pPreserveAttachments = copy(sub.pPreserveAttachments, sub.preserveAttachmentCount, alloc);
	}

	if (!copy_pnext_chain(create_info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}